

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O0

bool CreateDirPath<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> partialpath;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  char slashes [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname_local;
  
  i._5_2_ = 0x2f5c;
  i._7_1_ = 0;
  pbStack_18 = dirname;
  partialpath.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)dirname,(long)&i + 5);
  while (partialpath.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)pbStack_18);
    iVar2 = GetFileInfo<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
    if ((iVar2 != 1) ||
       (bVar1 = CreateDirectory<char>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48), uVar5 = partialpath.field_2._8_8_, bVar1)) {
      bVar1 = false;
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      error("CreateDirectory([%d]%ls)",uVar5,uVar3);
      dirname_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) goto LAB_001159ef;
    partialpath.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)pbStack_18,(long)&i + 5)
    ;
  }
  uVar4 = std::__cxx11::string::size();
  if (((uVar4 < 2) || (iVar2 = GetFileInfo<char>(pbStack_18), iVar2 != 1)) ||
     (bVar1 = CreateDirectory<char>(pbStack_18), bVar1)) {
    dirname_local._7_1_ = 1;
  }
  else {
    uVar5 = std::__cxx11::string::c_str();
    error("CreateDirectory(%s)",uVar5);
    dirname_local._7_1_ = 0;
  }
LAB_001159ef:
  return (bool)(dirname_local._7_1_ & 1);
}

Assistant:

bool CreateDirPath(const std::basic_string<T>& dirname)
{
    T slashes[3]= { '\\', '/', 0};
    for (size_t i= dirname.find_first_of(slashes, 1) ; i!=dirname.npos ; i= dirname.find_first_of(slashes, i+1)) {
        std::basic_string<T> partialpath= dirname.substr(0, i);
        if (GetFileInfo(partialpath)==AT_NONEXISTANT
            && !CreateDirectory(partialpath)) {
            logerror("CreateDirectory([%d]%ls)", i, partialpath.c_str());
            return false;
        }
    }
    if (dirname.size()>1 && GetFileInfo(dirname)==AT_NONEXISTANT && !CreateDirectory(dirname)) {
        logerror("CreateDirectory(%s)", dirname.c_str());
        return false;
    }
    return true;
}